

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::createDefinition
          (Compilation *this,Scope *scope,LookupLocation location,ModuleDeclarationSyntax *syntax)

{
  NetType **ppNVar1;
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *arrays_;
  size_t *psVar2;
  flat_hash_map<const_syntax::ModuleDeclarationSyntax_*,_std::vector<DefinitionSymbol_*>_>
  *arrays__00;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  undefined4 uVar5;
  group_type_pointer pgVar6;
  group_type_pointer pgVar7;
  value_type_pointer ppVar8;
  iterator __position;
  RootSymbol *pRVar9;
  uint uVar10;
  int iVar11;
  undefined1 auVar12 [16];
  _Optional_payload_base<slang::TimeScale> timeScale;
  ulong uVar13;
  NetType *pNVar14;
  DefinitionSymbol *pDVar15;
  reference pvVar16;
  ulong uVar17;
  Scope *pSVar18;
  uint uVar19;
  value_type *elements;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *ppVar23;
  value_type_pointer ppVar24;
  Scope *pSVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  LookupLocation lookupLocation;
  SourceRange sourceRange;
  try_emplace_args_t local_99;
  pointer def;
  ulong local_90;
  ModuleDeclarationSyntax *local_88;
  ulong local_80;
  Scope *local_78;
  locator res;
  
  lookupLocation.scope = location.scope;
  local_80 = CONCAT44(local_80._4_4_,location.index);
  arrays_ = &this->syntaxMetadata;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = syntax;
  local_90 = SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar12 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar13 = local_90 >>
           ((byte)(this->syntaxMetadata).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar6 = (this->syntaxMetadata).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
           .arrays.groups_;
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[local_90 & 0xff];
  ppVar24 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  uVar22 = (this->syntaxMetadata).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
           .arrays.groups_size_mask;
  uVar17 = 0;
  uVar21 = uVar13;
  do {
    pgVar3 = pgVar6 + uVar21;
    uVar28 = (uchar)uVar5;
    auVar26[0] = -(pgVar3->m[0].n == uVar28);
    uVar29 = (uchar)((uint)uVar5 >> 8);
    auVar26[1] = -(pgVar3->m[1].n == uVar29);
    uVar30 = (uchar)((uint)uVar5 >> 0x10);
    auVar26[2] = -(pgVar3->m[2].n == uVar30);
    uVar31 = (uchar)((uint)uVar5 >> 0x18);
    auVar26[3] = -(pgVar3->m[3].n == uVar31);
    auVar26[4] = -(pgVar3->m[4].n == uVar28);
    auVar26[5] = -(pgVar3->m[5].n == uVar29);
    auVar26[6] = -(pgVar3->m[6].n == uVar30);
    auVar26[7] = -(pgVar3->m[7].n == uVar31);
    auVar26[8] = -(pgVar3->m[8].n == uVar28);
    auVar26[9] = -(pgVar3->m[9].n == uVar29);
    auVar26[10] = -(pgVar3->m[10].n == uVar30);
    auVar26[0xb] = -(pgVar3->m[0xb].n == uVar31);
    auVar26[0xc] = -(pgVar3->m[0xc].n == uVar28);
    auVar26[0xd] = -(pgVar3->m[0xd].n == uVar29);
    auVar26[0xe] = -(pgVar3->m[0xe].n == uVar30);
    auVar26[0xf] = -(pgVar3->m[0xf].n == uVar31);
    for (uVar19 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe); uVar19 != 0;
        uVar19 = uVar19 - 1 & uVar19) {
      uVar10 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar24[uVar21 * 0xf + (ulong)uVar10].first == syntax) {
        ppVar24 = ppVar24 + uVar21 * 0xf + (ulong)uVar10;
        goto LAB_0014e909;
      }
    }
    if ((pgVar6[uVar21].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)local_90 & 7]) == 0) break;
    lVar20 = uVar21 + uVar17;
    uVar17 = uVar17 + 1;
    uVar21 = lVar20 + 1U & uVar22;
  } while (uVar17 <= uVar22);
  ppVar24 = (value_type_pointer)0x0;
LAB_0014e909:
  def = (pointer)syntax;
  local_78 = scope;
  if (ppVar24 == (value_type_pointer)0x0) {
    if ((this->syntaxMetadata).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
        .size_ctrl.size <
        (this->syntaxMetadata).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                       *)arrays_,(arrays_type *)arrays_,uVar13,local_90,
                 (try_emplace_args_t *)&local_88,(SyntaxNode **)&def);
      psVar2 = &(this->syntaxMetadata).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                .size_ctrl.size;
      *psVar2 = *psVar2 + 1;
      ppVar24 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                       *)arrays_,local_90,(try_emplace_args_t *)&local_88,(SyntaxNode **)&def);
      ppVar24 = res.p;
    }
  }
  if ((ppVar24->second).defaultNetType == (NetType *)0x0) {
    pNVar14 = Scope::getDefaultNetType(local_78);
    (ppVar24->second).defaultNetType = pNVar14;
  }
  pNVar14 = (ppVar24->second).defaultNetType;
  pDVar15 = (DefinitionSymbol *)operator_new(0x2e8);
  lookupLocation.index = (undefined4)local_80;
  lookupLocation._12_4_ = 0;
  DefinitionSymbol::DefinitionSymbol
            (pDVar15,local_78,lookupLocation,syntax,pNVar14,(ppVar24->second).unconnectedDrive,
             (ppVar24->second).cellDefine,
             (optional<slang::TimeScale>)
             (ppVar24->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::TimeScale>,(ppVar24->second).tree);
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pDVar15;
  pvVar16 = std::
            vector<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>,std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>>
            ::
            emplace_back<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>
                      ((vector<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>,std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>>
                        *)&this->definitionMemory,
                       (unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                        *)&res);
  pDVar15 = (pvVar16->_M_t).
            super___uniq_ptr_impl<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::DefinitionSymbol_*,_std::default_delete<slang::ast::DefinitionSymbol>_>
            .super__Head_base<0UL,_slang::ast::DefinitionSymbol_*,_false>._M_head_impl;
  if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)0x0) {
    std::default_delete<slang::ast::DefinitionSymbol>::operator()
              ((default_delete<slang::ast::DefinitionSymbol> *)&res,(DefinitionSymbol *)res.pg);
  }
  uVar21 = local_90 >>
           ((byte)(this->definitionFromSyntax).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  arrays__00 = &this->definitionFromSyntax;
  pgVar7 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.groups_;
  ppVar8 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.elements_;
  local_80 = (this->definitionFromSyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
             .arrays.groups_size_mask;
  uVar13 = 0;
  uVar22 = uVar21;
  do {
    pgVar4 = pgVar7 + uVar22;
    auVar27[0] = -(pgVar4->m[0].n == uVar28);
    auVar27[1] = -(pgVar4->m[1].n == uVar29);
    auVar27[2] = -(pgVar4->m[2].n == uVar30);
    auVar27[3] = -(pgVar4->m[3].n == uVar31);
    auVar27[4] = -(pgVar4->m[4].n == uVar28);
    auVar27[5] = -(pgVar4->m[5].n == uVar29);
    auVar27[6] = -(pgVar4->m[6].n == uVar30);
    auVar27[7] = -(pgVar4->m[7].n == uVar31);
    auVar27[8] = -(pgVar4->m[8].n == uVar28);
    auVar27[9] = -(pgVar4->m[9].n == uVar29);
    auVar27[10] = -(pgVar4->m[10].n == uVar30);
    auVar27[0xb] = -(pgVar4->m[0xb].n == uVar31);
    auVar27[0xc] = -(pgVar4->m[0xc].n == uVar28);
    auVar27[0xd] = -(pgVar4->m[0xd].n == uVar29);
    auVar27[0xe] = -(pgVar4->m[0xe].n == uVar30);
    auVar27[0xf] = -(pgVar4->m[0xf].n == uVar31);
    for (uVar19 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe); uVar19 != 0;
        uVar19 = uVar19 - 1 & uVar19) {
      iVar11 = 0;
      if (uVar19 != 0) {
        for (; (uVar19 >> iVar11 & 1) == 0; iVar11 = iVar11 + 1) {
        }
      }
      if (*(ModuleDeclarationSyntax **)
           ((long)&ppVar8[uVar22 * 0xf].first + (ulong)(uint)(iVar11 << 5)) == syntax) {
        ppVar23 = (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>
                   *)((long)&ppVar8[uVar22 * 0xf].first + (ulong)(uint)(iVar11 << 5));
        goto LAB_0014eac8;
      }
    }
    if ((pgVar7[uVar22].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)local_90 & 7]) == 0) break;
    lVar20 = uVar22 + uVar13;
    uVar13 = uVar13 + 1;
    uVar22 = lVar20 + 1U & local_80;
  } while (uVar13 <= local_80);
  ppVar23 = (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *
            )0x0;
LAB_0014eac8:
  def = pDVar15;
  local_88 = syntax;
  if (ppVar23 ==
      (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata> *)0x0)
  {
    if ((this->definitionFromSyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
        .size_ctrl.size <
        (this->definitionFromSyntax).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::ModuleDeclarationSyntax_const*>
                ((locator *)&res,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
                  *)arrays__00,(arrays_type *)arrays__00,uVar21,local_90,&local_99,&local_88);
      psVar2 = &(this->definitionFromSyntax).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                .size_ctrl.size;
      *psVar2 = *psVar2 + 1;
      ppVar23 = res.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::ModuleDeclarationSyntax_const*>
                ((locator *)&res,
                 (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
                  *)arrays__00,local_90,&local_99,&local_88);
      ppVar23 = res.p;
    }
  }
  __position._M_current = (DefinitionSymbol **)(ppVar23->second).defaultNetType;
  if (__position._M_current == *(DefinitionSymbol ***)&(ppVar23->second).timeScale) {
    std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>::
    _M_realloc_insert<slang::ast::DefinitionSymbol*const&>
              ((vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>
                *)&ppVar23->second,__position,&def);
  }
  else {
    *__position._M_current = def;
    ppNVar1 = &(ppVar23->second).defaultNetType;
    *ppNVar1 = (NetType *)&((*ppNVar1)->super_Symbol).name;
  }
  pSVar25 = local_78;
  insertDefinition(this,&def->super_Symbol,local_78);
  pRVar9 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  pSVar18 = &pRVar9->super_Scope;
  if (pRVar9 == (RootSymbol *)0x0) {
    pSVar18 = (Scope *)0x0;
  }
  if (pSVar25->thisSym->kind == CompilationUnit) {
    pSVar25 = pSVar18;
  }
  if (pSVar25 == pSVar18) {
    timeScale = (def->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>;
    sourceRange = parsing::Token::range(&((syntax->header).ptr)->name);
    checkElemTimeScale(this,(optional<slang::TimeScale>)timeScale,sourceRange);
  }
  return;
}

Assistant:

void Compilation::createDefinition(const Scope& scope, LookupLocation location,
                                   const ModuleDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    // We can only be missing metadata if the definition is created programmatically
    // (i.e. not via the parser) so we just fill in the parent's default net type
    // so that it's not a null pointer.
    auto& metadata = syntaxMetadata[&syntax];
    if (!metadata.defaultNetType)
        metadata.defaultNetType = &scope.getDefaultNetType();

    auto def = definitionMemory
                   .emplace_back(std::make_unique<DefinitionSymbol>(
                       scope, location, syntax, *metadata.defaultNetType, metadata.unconnectedDrive,
                       metadata.cellDefine, metadata.timeScale, metadata.tree))
                   .get();
    definitionFromSyntax[&syntax].push_back(def);

    insertDefinition(*def, scope);

    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    const bool isRoot = targetScope == root.get();
    if (isRoot)
        checkElemTimeScale(def->timeScale, syntax.header->name.range());
}